

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

bool duckdb::Date::TryConvertDateSpecial(char *buf,idx_t len,idx_t *pos,char *special)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  char s;
  byte bVar6;
  
  uVar3 = *pos;
  uVar4 = uVar3;
  pcVar5 = special;
  if (uVar3 <= len && len - uVar3 != 0) {
    pcVar5 = special + (len - uVar3);
    do {
      uVar4 = uVar3;
      if (*special == 0) goto LAB_00da6d35;
      bVar1 = buf[uVar3];
      bVar6 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar6 = bVar1;
      }
      if (bVar6 != *special) goto LAB_00da6d31;
      special = (char *)((byte *)special + 1);
      uVar3 = uVar3 + 1;
      uVar4 = len;
    } while (len != uVar3);
  }
  if (*pcVar5 == '\0') {
LAB_00da6d35:
    *pos = uVar4;
    bVar2 = true;
  }
  else {
LAB_00da6d31:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Date::TryConvertDateSpecial(const char *buf, idx_t len, idx_t &pos, const char *special) {
	auto p = pos;
	for (; p < len && *special; ++p) {
		const auto s = *special++;
		if (!s || StringUtil::CharacterToLower(buf[p]) != s) {
			return false;
		}
	}
	if (*special) {
		return false;
	}
	pos = p;
	return true;
}